

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O3

Var Js::JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk
              (JavascriptFunction *function,CallInfo *callInfo,Arguments *args,
              ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  EventLog *this;
  code *pcVar2;
  bool bVar3;
  Var result;
  RecyclableData *pRVar4;
  undefined4 *puVar5;
  int rootDepth;
  undefined1 local_80 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  Var local_48;
  int32 *local_40;
  bool local_31;
  
  local_48 = (Var)0x0;
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    pTVar1 = scriptContext->threadContext;
    pTVar1->TTDRootNestingCount = pTVar1->TTDRootNestingCount + 1;
    TTD::EventLog::ReplayExternalCallEvent(pTVar1->TTDLog,function,args,&local_48);
    pTVar1->TTDRootNestingCount = pTVar1->TTDRootNestingCount + -1;
    result = local_48;
  }
  else {
    if (scriptContext->TTDShouldPerformRecordAction == false) {
      TTDAbort_unrecoverable_error("Check either record/replay before calling!!!");
    }
    pTVar1 = scriptContext->threadContext;
    this = pTVar1->TTDLog;
    local_40 = &pTVar1->TTDRootNestingCount;
    rootDepth = pTVar1->TTDRootNestingCount + 1;
    pTVar1->TTDRootNestingCount = rootDepth;
    __leaveScriptObject._32_8_ =
         TTD::EventLog::RecordExternalCallEvent(this,function,rootDepth,args,false);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_80,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    local_31 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    result = (Var)(*(code *)function[1].functionInfo.ptr)(function,*callInfo,args->Values);
    pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&scriptContext->threadContext->recyclableData);
    if ((pRVar4->exceptionObject).ptr != (JavascriptExceptionObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                  ,0x18e,"(!scriptContext->HasRecordedException())",
                                  "!scriptContext->HasRecordedException()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = local_31;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_80);
    TTD::EventLog::RecordExternalCallEvent_Complete
              (this,function,(EventLogEntry *)__leaveScriptObject._32_8_,result);
    *local_40 = *local_40 + -1;
  }
  return result;
}

Assistant:

Var JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk(Js::JavascriptFunction* function, CallInfo& callInfo, Arguments& args, ScriptContext* scriptContext)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        Var result = nullptr;

        if(scriptContext->ShouldPerformReplayAction())
        {
            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            scriptContext->GetThreadContext()->TTDLog->ReplayExternalCallEvent(externalFunction, args, &result);
        }
        else
        {
            TTDAssert(scriptContext->ShouldPerformRecordAction(), "Check either record/replay before calling!!!");

            TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;

            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            TTD::NSLogEvents::EventLogEntry* callEvent = elog->RecordExternalCallEvent(externalFunction, scriptContext->GetThreadContext()->TTDRootNestingCount, args, false);

            BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
            {
                // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
                result = externalFunction->nativeMethod(function, callInfo, args.Values);
            }
            END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);

            //Exceptions should be prohibited so no need to do extra work
            elog->RecordExternalCallEvent_Complete(externalFunction, callEvent, result);
        }

        return result;
    }